

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O2

int jpc_dec_process_sod(jpc_dec_t *dec,jpc_ms_t *ms)

{
  byte bVar1;
  jpc_dec_tile_t *tile;
  jpc_streamlist_t *pjVar2;
  jpc_ppxstab_t *pjVar3;
  jpc_ppxstabent_t *pjVar4;
  jpc_dec_cp_t *pjVar5;
  uint_fast32_t uVar6;
  uint_fast32_t uVar7;
  jpc_pchglist_t *pchglist;
  FILE *__stream;
  int iVar8;
  int iVar9;
  jas_stream_t *pjVar10;
  jpc_dec_rlvl_t *pjVar11;
  jpc_dec_band_t **ppjVar12;
  jas_matrix_t *pjVar13;
  jpc_tsfb_t *tsfb;
  jpc_dec_band_t *pjVar14;
  jpc_dec_prc_t *pjVar15;
  jpc_tagtree_t *pjVar16;
  jpc_pi_t *pjVar17;
  jpc_pchg_t *pjVar18;
  byte bVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  jpc_dec_tcomp_t *pjVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  jpc_dec_ccp_t *pjVar28;
  ulong uVar29;
  ulong uVar30;
  int compno;
  uint_fast16_t *puVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong xend;
  uint uVar37;
  jas_matrix_t **ppjVar38;
  ulong uVar39;
  long lVar40;
  bool bVar41;
  ulong local_1360;
  ulong local_1358;
  jpc_dec_tile_t *local_1350;
  jpc_dec_cblk_t *local_1348;
  ulong local_1340;
  ulong local_1338;
  jpc_dec_cmpt_t *local_1330;
  jpc_tsfb_band_t local_12f8 [100];
  
  tile = dec->curtile;
  if (tile == (jpc_dec_tile_t *)0x0) {
    return -1;
  }
  if (tile->partno == 0) {
    pjVar5 = tile->cp;
    if ((~pjVar5->flags & 3U) != 0) {
      return -1;
    }
    iVar8 = pjVar5->numcomps;
    lVar27 = (long)iVar8;
    pjVar28 = pjVar5->ccps;
    puVar31 = &pjVar28->numstepsizes;
    while (bVar41 = lVar27 != 0, lVar27 = lVar27 + -1, bVar41) {
      if (*(uint_fast8_t *)((long)puVar31 + -7) == '\x01') {
        if (*puVar31 != 1) {
          return -1;
        }
      }
      else if ((int)*puVar31 <
               (int)((uint)*(uint_fast8_t *)((long)puVar31 + -0xb) +
                     (uint)*(uint_fast8_t *)((long)puVar31 + -0xb) * 2 + -2)) {
        return -1;
      }
      puVar31 = puVar31 + 0x70;
    }
    for (iVar20 = 0; iVar20 < iVar8; iVar20 = iVar20 + 1) {
      if ((pjVar28->csty & 1) == 0) {
        for (lVar27 = 0x33b; lVar27 != 0x35c; lVar27 = lVar27 + 1) {
          *(undefined1 *)((long)pjVar28->stepsizes + lVar27 + -0x18) = 0xf;
          *(undefined1 *)((long)pjVar28->stepsizes + lVar27 + 9) = 0xf;
        }
      }
      if (pjVar28->qsty == '\x01') {
        uVar36 = pjVar28->stepsizes[0];
        uVar24 = (uint)pjVar28->numrlvls + (uint)pjVar28->numrlvls * 2;
        if (uVar24 < 3) {
          uVar24 = 2;
        }
        for (uVar39 = 0; uVar24 - 2 != uVar39; uVar39 = uVar39 + 1) {
          uVar37 = ((int)uVar39 + 2U) / 3 + ((uint)(uVar36 >> 0xb) & 0x1fffff);
          if (0x1f < uVar37) {
            return -1;
          }
          pjVar28->stepsizes[uVar39] = (ulong)(uVar37 * 0x800 | (uint)uVar36 & 0x7ff);
        }
      }
      pjVar28 = pjVar28 + 1;
      iVar8 = pjVar5->numcomps;
    }
    pjVar23 = tile->tcomps;
    tile->realmode = (uint)(tile->cp->mctid == '\x01');
    local_1330 = dec->cmpts;
    for (lVar27 = 0; lVar27 < dec->numcomps; lVar27 = lVar27 + 1) {
      pjVar28 = tile->cp->ccps;
      if (pjVar28[lVar27].qmfbid == '\0') {
        tile->realmode = 1;
      }
      bVar19 = pjVar28[lVar27].numrlvls;
      pjVar23->numrlvls = (uint)bVar19;
      pjVar11 = (jpc_dec_rlvl_t *)jas_alloc2((ulong)bVar19,0x60);
      pjVar23->rlvls = pjVar11;
      if (pjVar11 == (jpc_dec_rlvl_t *)0x0) {
        return -1;
      }
      uVar24 = pjVar23->numrlvls;
      ppjVar12 = &pjVar11->bands;
      while (bVar41 = uVar24 != 0, uVar24 = uVar24 - 1, bVar41) {
        *ppjVar12 = (jpc_dec_band_t *)0x0;
        ppjVar12 = ppjVar12 + 0xc;
      }
      uVar36 = local_1330->hstep;
      uVar39 = local_1330->vstep;
      pjVar13 = jas_seq2d_create((tile->xstart + (uVar36 - 1)) / uVar36,
                                 (tile->ystart + (uVar39 - 1)) / uVar39,
                                 ((uVar36 - 1) + tile->xend) / uVar36,
                                 ((uVar39 - 1) + tile->yend) / uVar39);
      pjVar23->data = pjVar13;
      if (pjVar13 == (jas_matrix_t *)0x0) {
        return -1;
      }
      tsfb = jpc_cod_gettsfb((uint)pjVar28[lVar27].qmfbid,pjVar23->numrlvls - 1);
      pjVar23->tsfb = tsfb;
      if (tsfb == (jpc_tsfb_t *)0x0) {
        return -1;
      }
      pjVar13 = pjVar23->data;
      jpc_tsfb_getbands(tsfb,pjVar13->xstart_,pjVar13->ystart_,pjVar13->xend_,pjVar13->yend_,
                        local_12f8);
      pjVar11 = pjVar23->rlvls;
      uVar36 = 0;
      while( true ) {
        uVar24 = pjVar23->numrlvls;
        uVar37 = (uint)uVar36;
        if (uVar24 <= uVar37) break;
        pjVar11->bands = (jpc_dec_band_t *)0x0;
        bVar19 = (char)uVar24 + ~(byte)uVar36;
        lVar40 = (long)(1 << (bVar19 & 0x1f)) + -1;
        uVar29 = pjVar23->xstart + lVar40 >> (bVar19 & 0x3f);
        pjVar11->xstart = uVar29;
        uVar32 = pjVar23->ystart + lVar40 >> (bVar19 & 0x3f);
        pjVar11->ystart = uVar32;
        uVar33 = pjVar23->xend + lVar40 >> (bVar19 & 0x3f);
        pjVar11->xend = uVar33;
        uVar39 = lVar40 + pjVar23->yend >> (bVar19 & 0x3f);
        pjVar11->yend = uVar39;
        bVar19 = pjVar28[lVar27].prcwidthexpns[uVar36];
        uVar21 = (uint)bVar19;
        pjVar11->prcwidthexpn = (uint)bVar19;
        bVar1 = pjVar28[lVar27].prcheightexpns[uVar36];
        uVar24 = (uint)bVar1;
        local_1360 = -1L << (bVar19 & 0x3f);
        uVar36 = -1L << (bVar1 & 0x3f);
        pjVar11->prcheightexpn = (uint)bVar1;
        local_1338 = (uVar33 + (long)(1 << (bVar19 & 0x1f))) - 1 & local_1360;
        local_1360 = local_1360 & uVar29;
        local_1340 = uVar36 & uVar32;
        iVar20 = (int)(local_1338 - local_1360 >> (bVar19 & 0x3f));
        pjVar11->numhprcs = iVar20;
        iVar8 = (int)(((uVar39 + (long)(1 << (bVar1 & 0x1f))) - 1 & uVar36) - local_1340 >>
                     (bVar1 & 0x3f));
        pjVar11->numvprcs = iVar8;
        iVar8 = iVar8 * iVar20;
        pjVar11->numprcs = iVar8;
        if (0xffff < iVar8) {
          return -1;
        }
        if ((uVar29 < uVar33) && (uVar32 < uVar39)) {
          if (uVar37 == 0) {
            pjVar11->cbgwidthexpn = (uint)bVar19;
            pjVar11->cbgheightexpn = (uint)bVar1;
            uVar22 = 1;
          }
          else {
            uVar21 = bVar19 - 1;
            pjVar11->cbgwidthexpn = uVar21;
            uVar24 = bVar1 - 1;
            pjVar11->cbgheightexpn = uVar24;
            if (bVar19 == 0) {
              return -1;
            }
            if (bVar1 == 0) {
              return -1;
            }
            local_1338 = local_1338 + 1 >> 1;
            local_1340 = local_1340 + 1 >> 1;
            local_1360 = local_1360 + 1 >> 1;
            uVar22 = 3;
          }
          uVar26 = (uint)pjVar28[lVar27].cblkwidthexpn;
          if ((int)uVar21 < (int)(uint)pjVar28[lVar27].cblkwidthexpn) {
            uVar26 = uVar21;
          }
          pjVar11->cblkwidthexpn = (long)(int)uVar26;
          uVar21 = (uint)pjVar28[lVar27].cblkheightexpn;
          if ((int)uVar24 < (int)(uint)pjVar28[lVar27].cblkheightexpn) {
            uVar21 = uVar24;
          }
          pjVar11->cblkheightexpn = (long)(int)uVar21;
          pjVar11->numbands = uVar22;
          pjVar14 = (jpc_dec_band_t *)jas_alloc2((ulong)uVar22,0x30);
          pjVar11->bands = pjVar14;
          if (pjVar14 == (jpc_dec_band_t *)0x0) {
            return -1;
          }
          for (iVar8 = 0; iVar8 < pjVar11->numbands; iVar8 = iVar8 + 1) {
            iVar20 = uVar37 * 3 + -2 + iVar8;
            if (uVar37 == 0) {
              iVar20 = 0;
            }
            iVar25 = local_12f8[iVar20].orient;
            pjVar14->orient = iVar25;
            uVar24 = (uint)pjVar28[lVar27].stepsizes[iVar20];
            pjVar14->stepsize = uVar24;
            iVar25 = JPC_NOMINALGAIN((uint)pjVar28[lVar27].qmfbid,pjVar23->numrlvls - 1,uVar37,
                                     iVar25);
            pjVar14->analgain = iVar25;
            uVar36 = (ulong)(uVar24 & 0x7ff) * 4 + 0x2000;
            uVar24 = uVar24 >> 0xb;
            iVar25 = (iVar25 - uVar24) + (int)local_1330->prec;
            bVar19 = (byte)iVar25;
            uVar39 = uVar36 >> (-bVar19 & 0x3f);
            if (-1 < iVar25) {
              uVar39 = uVar36 << (bVar19 & 0x3f);
            }
            pjVar14->absstepsize = uVar39;
            iVar25 = uVar24 + pjVar28[lVar27].numguardbits;
            pjVar14->numbps = pjVar28[lVar27].numguardbits + uVar24 + -1;
            uVar24 = 0x20 - iVar25;
            if ((int)((pjVar28[lVar27].roishift - 1) + iVar25) < 0x20) {
              uVar24 = (uint)pjVar28[lVar27].roishift;
            }
            pjVar14->roishift = uVar24;
            pjVar14->prcs = (jpc_dec_prc_t *)0x0;
            pjVar14->data = (jas_matrix_t *)0x0;
            if ((local_12f8[iVar20].xstart != local_12f8[iVar20].xend) &&
               (local_12f8[iVar20].ystart != local_12f8[iVar20].yend)) {
              pjVar13 = jas_seq2d_create(0,0,0,0);
              pjVar14->data = pjVar13;
              if (pjVar13 == (jas_matrix_t *)0x0) {
                return -1;
              }
              iVar25 = jas_seq2d_bindsub(pjVar13,pjVar23->data,(long)local_12f8[iVar20].locxstart,
                                         (long)local_12f8[iVar20].locystart,
                                         (long)local_12f8[iVar20].locxend,
                                         (long)local_12f8[iVar20].locyend);
              if (iVar25 != 0) {
                return -1;
              }
              pjVar13 = pjVar14->data;
              iVar25 = local_12f8[iVar20].xstart;
              iVar20 = local_12f8[iVar20].ystart;
              pjVar13->xstart_ = (long)iVar25;
              pjVar13->ystart_ = (long)iVar20;
              pjVar13->xend_ = (long)iVar25 + pjVar13->numcols_;
              pjVar13->yend_ = (long)iVar20 + pjVar13->numrows_;
              if ((long)pjVar11->numprcs == 0) {
                __assert_fail("rlvl->numprcs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                              ,0x35b,"int jpc_dec_tileinit(jpc_dec_t *, jpc_dec_tile_t *)");
              }
              pjVar15 = (jpc_dec_prc_t *)jas_alloc2((long)pjVar11->numprcs,0x48);
              pjVar14->prcs = pjVar15;
              if (pjVar15 == (jpc_dec_prc_t *)0x0) {
                return -1;
              }
              iVar20 = pjVar11->numprcs;
              local_1358 = local_1360;
              uVar36 = local_1340;
              for (; 0 < iVar20; iVar20 = iVar20 + -1) {
                uVar32 = (long)(1 << ((byte)pjVar11->cbgwidthexpn & 0x1f)) + local_1358;
                uVar39 = (long)(1 << ((byte)pjVar11->cbgheightexpn & 0x1f)) + uVar36;
                pjVar13 = pjVar14->data;
                uVar29 = pjVar13->xstart_;
                if ((ulong)pjVar13->xstart_ < local_1358) {
                  uVar29 = local_1358;
                }
                pjVar15->xstart = uVar29;
                uVar33 = pjVar13->ystart_;
                if ((ulong)pjVar13->ystart_ < uVar36) {
                  uVar33 = uVar36;
                }
                pjVar15->ystart = uVar33;
                uVar30 = pjVar13->xend_;
                if (uVar32 < (ulong)pjVar13->xend_) {
                  uVar30 = uVar32;
                }
                pjVar15->xend = uVar30;
                if ((ulong)pjVar13->yend_ <= uVar39) {
                  uVar39 = pjVar13->yend_;
                }
                pjVar15->yend = uVar39;
                if ((uVar29 < uVar30) && (uVar33 < uVar39)) {
                  bVar19 = (byte)pjVar11->cblkwidthexpn;
                  uVar35 = -1L << (bVar19 & 0x3f);
                  bVar1 = (byte)pjVar11->cblkheightexpn;
                  uVar34 = -1L << (bVar1 & 0x3f);
                  iVar9 = (int)(((uVar30 + (long)(1 << (bVar19 & 0x1f))) - 1 & uVar35) -
                                (uVar29 & uVar35) >> (bVar19 & 0x3f));
                  pjVar15->numhcblks = iVar9;
                  iVar25 = (int)(((uVar39 + (long)(1 << (bVar1 & 0x1f))) - 1 & uVar34) -
                                 (uVar33 & uVar34) >> (bVar1 & 0x3f));
                  pjVar15->numvcblks = iVar25;
                  pjVar15->numcblks = iVar25 * iVar9;
                  if (iVar25 * iVar9 < 1) {
                    __assert_fail("prc->numcblks > 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                                  ,0x37f,"int jpc_dec_tileinit(jpc_dec_t *, jpc_dec_tile_t *)");
                  }
                  pjVar16 = jpc_tagtree_create(iVar9,iVar25);
                  pjVar15->incltagtree = pjVar16;
                  if (pjVar16 == (jpc_tagtree_t *)0x0) {
                    return -1;
                  }
                  pjVar16 = jpc_tagtree_create(pjVar15->numhcblks,pjVar15->numvcblks);
                  pjVar15->numimsbstagtree = pjVar16;
                  if (pjVar16 == (jpc_tagtree_t *)0x0) {
                    return -1;
                  }
                  local_1348 = (jpc_dec_cblk_t *)jas_alloc2((long)pjVar15->numcblks,0x50);
                  pjVar15->cblks = local_1348;
                  if (local_1348 == (jpc_dec_cblk_t *)0x0) {
                    return -1;
                  }
                  iVar25 = pjVar15->numcblks;
                  uVar39 = local_1358;
                  uVar29 = uVar36;
                  while (0 < iVar25) {
                    uVar34 = (long)(1 << ((byte)pjVar11->cblkwidthexpn & 0x1f)) + uVar39;
                    bVar19 = (byte)pjVar11->cblkheightexpn & 0x1f;
                    uVar33 = (long)(1 << bVar19) + uVar29;
                    uVar30 = pjVar15->xstart;
                    if (pjVar15->xstart < uVar39) {
                      uVar30 = uVar39;
                    }
                    uVar35 = pjVar15->ystart;
                    if (pjVar15->ystart < uVar29) {
                      uVar35 = uVar29;
                    }
                    xend = pjVar15->xend;
                    if (uVar34 < pjVar15->xend) {
                      xend = uVar34;
                    }
                    if (pjVar15->yend <= uVar33) {
                      uVar33 = pjVar15->yend;
                    }
                    if ((uVar30 < xend) && (uVar35 < uVar33)) {
                      local_1348->numpasses = 0;
                      (local_1348->segs).head = (jpc_dec_seg_t *)0x0;
                      (local_1348->segs).tail = (jpc_dec_seg_t *)0x0;
                      *(undefined8 *)((long)&(local_1348->segs).tail + 4) = 0;
                      *(undefined8 *)((long)&local_1348->curseg + 4) = 0;
                      local_1348->mqdec = (jpc_mqdec_t *)0x0;
                      local_1348->nulldec = (jpc_bitstream_t *)0x0;
                      local_1348->numlenbits = 3;
                      local_1348->firstpassno = -1;
                      local_1348->flags = (jas_matrix_t *)0x0;
                      pjVar13 = jas_seq2d_create(0,(ulong)(uint)(0 << bVar19),0,0);
                      local_1348->data = pjVar13;
                      if (pjVar13 == (jas_matrix_t *)0x0) {
                        return -1;
                      }
                      iVar9 = jas_seq2d_bindsub(pjVar13,pjVar14->data,uVar30,uVar35,xend,uVar33);
                      if (iVar9 != 0) {
                        return -1;
                      }
                      local_1348 = local_1348 + 1;
                      iVar25 = iVar25 + -1;
                      uVar34 = uVar39 + (long)(1 << ((byte)pjVar11->cblkwidthexpn & 0x1f));
                    }
                    uVar39 = uVar34;
                    if (uVar32 <= uVar34) {
                      uVar29 = uVar29 + (long)(1 << ((byte)pjVar11->cblkheightexpn & 0x1f));
                      uVar39 = local_1358;
                    }
                  }
                  uVar32 = local_1358 + (long)(1 << ((byte)pjVar11->cbgwidthexpn & 0x1f));
                }
                else {
                  pjVar15->cblks = (jpc_dec_cblk_t *)0x0;
                  pjVar15->incltagtree = (jpc_tagtree_t *)0x0;
                  pjVar15->numimsbstagtree = (jpc_tagtree_t *)0x0;
                }
                local_1358 = uVar32;
                if (local_1338 <= uVar32) {
                  uVar36 = uVar36 + (long)(1 << ((byte)pjVar11->cbgheightexpn & 0x1f));
                  local_1358 = local_1360;
                }
                pjVar15 = pjVar15 + 1;
              }
            }
            pjVar14 = pjVar14 + 1;
          }
        }
        else {
          pjVar11->bands = (jpc_dec_band_t *)0x0;
          pjVar11->numprcs = 0;
          pjVar11->numhprcs = 0;
          pjVar11->numvprcs = 0;
        }
        uVar36 = (ulong)(uVar37 + 1);
        pjVar11 = pjVar11 + 1;
      }
      pjVar23 = pjVar23 + 1;
      local_1330 = local_1330 + 1;
    }
    pjVar17 = jpc_dec_pi_create(dec,tile);
    tile->pi = pjVar17;
    if (pjVar17 == (jpc_pi_t *)0x0) {
      return -1;
    }
    iVar8 = 0;
    while( true ) {
      pchglist = tile->cp->pchglist;
      iVar20 = jpc_pchglist_numpchgs(pchglist);
      if (iVar20 <= iVar8) break;
      pjVar18 = jpc_pchglist_get(pchglist,iVar8);
      pjVar18 = jpc_pchg_copy(pjVar18);
      if (pjVar18 == (jpc_pchg_t *)0x0) {
        __assert_fail("pchg",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                      ,0x3ce,"int jpc_dec_tileinit(jpc_dec_t *, jpc_dec_tile_t *)");
      }
      jpc_pi_addpchg(tile->pi,pjVar18);
      iVar8 = iVar8 + 1;
    }
    jpc_pi_init(tile->pi);
  }
  pjVar2 = dec->pkthdrstreams;
  if (pjVar2 != (jpc_streamlist_t *)0x0) {
    iVar8 = pjVar2->numstreams;
    if ((long)iVar8 < 1) {
      abort();
    }
    pjVar10 = *pjVar2->streams;
    for (lVar27 = 1; iVar8 != lVar27; lVar27 = lVar27 + 1) {
      pjVar2->streams[lVar27 + -1] = pjVar2->streams[lVar27];
    }
    pjVar2->numstreams = iVar8 + -1;
    tile->pkthdrstream = pjVar10;
    if (pjVar10 == (jas_stream_t *)0x0) {
      return -1;
    }
  }
  if (tile->pptstab != (jpc_ppxstab_t *)0x0) {
    pjVar10 = tile->pkthdrstream;
    if (pjVar10 == (jas_stream_t *)0x0) {
      pjVar10 = jas_stream_memopen((char *)0x0,0);
      tile->pkthdrstream = pjVar10;
      if (pjVar10 == (jas_stream_t *)0x0) {
        return -1;
      }
    }
    lVar27 = jas_stream_tell(pjVar10);
    lVar40 = 0;
    jas_stream_seek(pjVar10,0,2);
    pjVar3 = tile->pptstab;
    pjVar10 = tile->pkthdrstream;
    while (lVar40 < pjVar3->numents) {
      pjVar4 = pjVar3->ents[lVar40];
      iVar8 = jas_stream_write(pjVar10,pjVar4->data,(uint)pjVar4->len);
      lVar40 = lVar40 + 1;
      if (iVar8 != (int)pjVar4->len) {
        return -1;
      }
    }
    jas_stream_seek(tile->pkthdrstream,(long)(int)lVar27,0);
    jpc_ppxstab_destroy(tile->pptstab);
    tile->pptstab = (jpc_ppxstab_t *)0x0;
  }
  iVar8 = jas_getdbglevel();
  __stream = _stderr;
  if (9 < iVar8) {
    iVar8 = dec->numtiles;
    local_1350 = dec->tiles;
    if (local_1350 == (jpc_dec_tile_t *)0x0 && iVar8 != 0) {
      __assert_fail("!dec->numtiles || dec->tiles",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                    ,0x887,"int jpc_dec_dump(jpc_dec_t *, FILE *)");
    }
    for (iVar20 = 0; iVar20 < iVar8; iVar20 = iVar20 + 1) {
      iVar8 = dec->numcomps;
      pjVar23 = local_1350->tcomps;
      if ((iVar8 != 0) && (pjVar23 == (jpc_dec_tcomp_t *)0x0)) {
        __assert_fail("!dec->numcomps || tile->tcomps",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                      ,0x88a,"int jpc_dec_dump(jpc_dec_t *, FILE *)");
      }
      for (iVar25 = 0; iVar25 < iVar8; iVar25 = iVar25 + 1) {
        pjVar11 = pjVar23->rlvls;
        for (uVar24 = 0; uVar24 < pjVar23->numrlvls; uVar24 = uVar24 + 1) {
          fprintf(__stream,"RESOLUTION LEVEL %d\n");
          fprintf(__stream,"xs = %lu, ys = %lu, xe = %lu, ye = %lu, w = %lu, h = %lu\n");
          iVar8 = pjVar11->numbands;
          pjVar14 = pjVar11->bands;
          if (pjVar14 == (jpc_dec_band_t *)0x0 && iVar8 != 0) {
            __assert_fail("!rlvl->numbands || rlvl->bands",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                          ,0x893,"int jpc_dec_dump(jpc_dec_t *, FILE *)");
          }
          for (uVar36 = 0; (int)uVar36 < iVar8; uVar36 = (ulong)((int)uVar36 + 1)) {
            fprintf(__stream,"BAND %d\n",uVar36);
            pjVar13 = pjVar14->data;
            if (pjVar13 == (jas_matrix_t *)0x0) {
              fwrite("band has no data (null pointer)\n",0x20,1,__stream);
              if (pjVar14->prcs != (jpc_dec_prc_t *)0x0) {
                __assert_fail("!band->prcs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                              ,0x899,"int jpc_dec_dump(jpc_dec_t *, FILE *)");
              }
            }
            else {
              lVar27 = pjVar13->xstart_;
              lVar40 = pjVar13->xend_;
              fprintf(__stream,"xs = %li, ys = %li, xe = %li, ye = %li, w = %li, h = %li\n");
              iVar8 = pjVar11->numprcs;
              lVar27 = CONCAT71((int7)((ulong)(lVar40 - lVar27) >> 8),iVar8 != 0);
              pjVar15 = pjVar14->prcs;
              if (iVar8 != 0 && pjVar15 == (jpc_dec_prc_t *)0x0) {
                __assert_fail("!rlvl->numprcs || band->prcs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                              ,0x8a5,"int jpc_dec_dump(jpc_dec_t *, FILE *)");
              }
              for (uVar39 = 0; (int)uVar39 < iVar8; uVar39 = (ulong)((int)uVar39 + 1)) {
                fprintf(__stream,"CODE BLOCK GROUP %d\n",uVar39,lVar27);
                uVar6 = pjVar15->xstart;
                uVar7 = pjVar15->xend;
                fprintf(__stream,"xs = %lu, ys = %lu, xe = %lu, ye = %lu, w = %lu, h = %lu\n");
                iVar8 = pjVar15->numcblks;
                lVar27 = CONCAT71((int7)(uVar7 - uVar6 >> 8),iVar8 != 0);
                if (iVar8 != 0 && pjVar15->cblks == (jpc_dec_cblk_t *)0x0) {
                  __assert_fail("!prc->numcblks || prc->cblks",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                                ,0x8ad,"int jpc_dec_dump(jpc_dec_t *, FILE *)");
                }
                ppjVar38 = &pjVar15->cblks->data;
                for (uVar37 = 0; (int)uVar37 < iVar8; uVar37 = uVar37 + 1) {
                  fprintf(__stream,"CODE BLOCK %d\n",(ulong)uVar37,lVar27);
                  lVar27 = (*ppjVar38)->xend_ - (*ppjVar38)->xstart_;
                  fprintf(__stream,"xs = %li, ys = %li, xe = %li, ye = %li, w = %li, h = %li\n");
                  iVar8 = pjVar15->numcblks;
                  ppjVar38 = ppjVar38 + 10;
                }
                pjVar15 = pjVar15 + 1;
                iVar8 = pjVar11->numprcs;
              }
            }
            pjVar14 = pjVar14 + 1;
            iVar8 = pjVar11->numbands;
          }
          pjVar11 = pjVar11 + 1;
        }
        pjVar23 = pjVar23 + 1;
        iVar8 = dec->numcomps;
      }
      local_1350 = local_1350 + 1;
      iVar8 = dec->numtiles;
    }
  }
  pjVar10 = tile->pkthdrstream;
  if (tile->pkthdrstream == (jas_stream_t *)0x0) {
    pjVar10 = dec->in;
  }
  iVar8 = jpc_dec_decodepkts(dec,pjVar10,dec->in);
  if (iVar8 != 0) {
    jas_eprintf("jpc_dec_decodepkts failed\n");
    return -1;
  }
  uVar36 = dec->curtileendoff;
  if (0 < (long)uVar36) {
    uVar39 = dec->in->rwcnt_;
    lVar27 = uVar39 - uVar36;
    if ((long)uVar39 < (long)uVar36) {
      jas_eprintf("warning: ignoring trailing garbage (%lu bytes)\n",uVar36 - uVar39);
      for (; lVar27 != 0; lVar27 = lVar27 + 1) {
        pjVar10 = dec->in;
        if ((pjVar10->flags_ & 7U) != 0) {
LAB_0011cbd1:
          jas_eprintf("read error\n");
          return -1;
        }
        if ((-1 < pjVar10->rwlimit_) && (pjVar10->rwlimit_ <= pjVar10->rwcnt_)) {
          pjVar10->flags_ = pjVar10->flags_ | 4;
          goto LAB_0011cbd1;
        }
        iVar8 = pjVar10->cnt_;
        pjVar10->cnt_ = iVar8 + -1;
        if (iVar8 < 1) {
          iVar8 = jas_stream_fillbuf(pjVar10,1);
          if (iVar8 == -1) goto LAB_0011cbd1;
        }
        else {
          pjVar10->rwcnt_ = pjVar10->rwcnt_ + 1;
          pjVar10->ptr_ = pjVar10->ptr_ + 1;
        }
      }
    }
    else if (uVar36 <= uVar39 && lVar27 != 0) {
      jas_eprintf("warning: not enough tile data (%lu bytes)\n",lVar27);
    }
  }
  iVar8 = tile->partno;
  if (iVar8 == tile->numparts + -1 && 0 < tile->numparts) {
    iVar8 = jpc_dec_tiledecode(dec,tile);
    if (iVar8 != 0) {
      return -1;
    }
    jpc_dec_tilefini(dec,tile);
    iVar8 = tile->partno;
  }
  dec->curtile = (jpc_dec_tile_t *)0x0;
  tile->partno = iVar8 + 1;
  dec->state = 8;
  return 0;
}

Assistant:

static int jpc_dec_process_sod(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_dec_tile_t *tile;
	int pos;

	/* Eliminate compiler warnings about unused variables. */
	(void)ms;

	if (!(tile = dec->curtile)) {
		return -1;
	}

	if (!tile->partno) {
		if (!jpc_dec_cp_isvalid(tile->cp)) {
			return -1;
		}
		if (jpc_dec_cp_prepare(tile->cp)) {
			return -1;
		}
		if (jpc_dec_tileinit(dec, tile)) {
			return -1;
		}
	}

	/* Are packet headers stored in the main header or tile-part header? */
	if (dec->pkthdrstreams) {
		/* Get the stream containing the packet header data for this
		  tile-part. */
		if (!(tile->pkthdrstream = jpc_streamlist_remove(dec->pkthdrstreams, 0))) {
			return -1;
		}
	}

	if (tile->pptstab) {
		if (!tile->pkthdrstream) {
			if (!(tile->pkthdrstream = jas_stream_memopen(0, 0))) {
				return -1;
			}
		}
		pos = jas_stream_tell(tile->pkthdrstream);
		jas_stream_seek(tile->pkthdrstream, 0, SEEK_END);
		if (jpc_pptstabwrite(tile->pkthdrstream, tile->pptstab)) {
			return -1;
		}
		jas_stream_seek(tile->pkthdrstream, pos, SEEK_SET);
		jpc_ppxstab_destroy(tile->pptstab);
		tile->pptstab = 0;
	}

	if (jas_getdbglevel() >= 10) {
		jpc_dec_dump(dec, stderr);
	}

	if (jpc_dec_decodepkts(dec, (tile->pkthdrstream) ? tile->pkthdrstream :
	  dec->in, dec->in)) {
		jas_eprintf("jpc_dec_decodepkts failed\n");
		return -1;
	}

	/* Gobble any unconsumed tile data. */
	if (dec->curtileendoff > 0) {
		long curoff;
		uint_fast32_t n;
		curoff = jas_stream_getrwcount(dec->in);
		if (curoff < dec->curtileendoff) {
			n = dec->curtileendoff - curoff;
			jas_eprintf("warning: ignoring trailing garbage (%lu bytes)\n",
			  (unsigned long) n);

			while (n-- > 0) {
				if (jas_stream_getc(dec->in) == EOF) {
					jas_eprintf("read error\n");
					return -1;
				}
			}
		} else if (curoff > dec->curtileendoff) {
			jas_eprintf("warning: not enough tile data (%lu bytes)\n",
			  (unsigned long) curoff - dec->curtileendoff);
		}

	}

	if (tile->numparts > 0 && tile->partno == tile->numparts - 1) {
		if (jpc_dec_tiledecode(dec, tile)) {
			return -1;
		}
		jpc_dec_tilefini(dec, tile);
	}

	dec->curtile = 0;

	/* Increment the expected tile-part number. */
	++tile->partno;

	/* We should expect to encounter a SOT marker segment next. */
	dec->state = JPC_TPHSOT;

	return 0;
}